

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

void cbb_init(CBB *cbb,uint8_t *buf,size_t cap,int can_resize)

{
  int can_resize_local;
  size_t cap_local;
  uint8_t *buf_local;
  CBB *cbb_local;
  
  cbb->is_child = '\0';
  cbb->child = (CBB *)0x0;
  (cbb->u).base.buf = buf;
  (cbb->u).base.len = 0;
  (cbb->u).base.cap = cap;
  *(byte *)((long)&cbb->u + 0x18) = *(byte *)((long)&cbb->u + 0x18) & 0xfe | (byte)can_resize & 1;
  *(byte *)((long)&cbb->u + 0x18) = *(byte *)((long)&cbb->u + 0x18) & 0xfd;
  return;
}

Assistant:

static void cbb_init(CBB *cbb, uint8_t *buf, size_t cap, int can_resize) {
  cbb->is_child = 0;
  cbb->child = NULL;
  cbb->u.base.buf = buf;
  cbb->u.base.len = 0;
  cbb->u.base.cap = cap;
  cbb->u.base.can_resize = can_resize;
  cbb->u.base.error = 0;
}